

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uuid.cpp
# Opt level: O1

void __thiscall BasicUUID_Out_Test::TestBody(BasicUUID_Out_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  ostringstream str;
  AssertHelper local_1c0;
  internal local_1b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  pstore::operator<<((ostream *)local_188,&(this->super_BasicUUID).id_);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[37],std::__cxx11::string>
            (local_1b8,"\"84949cc5-4701-4a84-895b-354c584a981b\"","str.str ()",
             (char (*) [37])"84949cc5-4701-4a84-895b-354c584a981b",&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_1b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_1b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x36,message);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if ((long *)local_1a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1a8._M_dataplus._M_p + 8))();
    }
  }
  if (local_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1b0,local_1b0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

TEST_F (BasicUUID, Out) {
    std::ostringstream str;
    str << id_;
    EXPECT_EQ ("84949cc5-4701-4a84-895b-354c584a981b", str.str ());
}